

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O0

HtaFile * __thiscall hta::storage::file::Metric::file_hta(Metric *this,Duration interval)

{
  Mode MVar1;
  Meta meta;
  Meta meta_00;
  bool bVar2;
  pointer ppVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>_>_>,_bool>
  pVar4;
  _Rb_tree_iterator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>_>_>
  local_228 [2];
  _Base_ptr local_218;
  undefined1 local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  int64_t local_1f8;
  Duration local_1f0;
  Header local_1e8;
  Metric *local_1b0;
  path local_1a8;
  ReadWrite local_179;
  pair<std::_Rb_tree_iterator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>_>_>,_bool>
  local_178;
  _Rb_tree_iterator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>_>_>
  local_168 [2];
  _Base_ptr local_158;
  undefined1 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  int64_t local_138;
  Duration local_130;
  Header local_128;
  Metric *local_f0;
  path local_e8;
  Write local_b9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>_>_>,_bool>
  local_b8;
  _Rb_tree_iterator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>_>_>
  local_a8 [2];
  _Base_ptr local_98;
  undefined1 local_90;
  Metric *local_78;
  path local_70;
  Read local_41;
  pair<std::_Rb_tree_iterator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>_>_>,_bool>
  local_40;
  byte local_29;
  iterator iStack_28;
  bool added;
  _Self local_20;
  iterator it;
  Metric *this_local;
  Duration interval_local;
  
  it._M_node = (_Base_ptr)this;
  this_local = (Metric *)interval.__r;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>,_std::less<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>_>_>_>
       ::find(&this->files_hta_,(key_type *)&this_local);
  iStack_28 = std::
              map<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>,_std::less<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>_>_>_>
              ::end(&this->files_hta_);
  bVar2 = std::operator==(&local_20,&stack0xffffffffffffffd8);
  if (bVar2) {
    MVar1 = this->open_mode_;
    if (MVar1 == read) {
      local_78 = this_local;
      path_hta_abi_cxx11_(&local_70,this,(Duration)this_local);
      pVar4 = std::
              map<std::chrono::duration<long,std::ratio<1l,1000000000l>>,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>,std::less<std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>>
              ::try_emplace<hta::storage::file::FileOpenTag::Read,std::filesystem::__cxx11::path>
                        ((map<std::chrono::duration<long,std::ratio<1l,1000000000l>>,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>,std::less<std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>>
                          *)&this->files_hta_,(key_type *)&this_local,&local_41,&local_70);
      local_98 = (_Base_ptr)pVar4.first._M_node;
      local_90 = pVar4.second;
      local_40.first._M_node = local_98;
      local_40.second = (bool)local_90;
      std::
      tie<std::_Rb_tree_iterator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>,bool>
                (local_a8,(bool *)&local_20);
      std::
      tuple<std::_Rb_tree_iterator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>&,bool&>
      ::operator=((tuple<std::_Rb_tree_iterator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>&,bool&>
                   *)local_a8,&local_40);
      std::filesystem::__cxx11::path::~path(&local_70);
    }
    else if (MVar1 == write) {
      local_f0 = this_local;
      path_hta_abi_cxx11_(&local_e8,this,(Duration)this_local);
      local_130.__r = (rep)this_local;
      (**(this->super_Metric)._vptr_Metric)(&local_148);
      meta.interval_max.__r = uStack_140;
      meta.interval_min.__r = local_148;
      meta.interval_factor = local_138;
      Header::Header(&local_128,local_130,meta);
      pVar4 = std::
              map<std::chrono::duration<long,std::ratio<1l,1000000000l>>,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>,std::less<std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>>
              ::
              try_emplace<hta::storage::file::FileOpenTag::Write,std::filesystem::__cxx11::path,hta::storage::file::Metric::Header>
                        ((map<std::chrono::duration<long,std::ratio<1l,1000000000l>>,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>,std::less<std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>>
                          *)&this->files_hta_,(key_type *)&this_local,&local_b9,&local_e8,&local_128
                        );
      local_158 = (_Base_ptr)pVar4.first._M_node;
      local_150 = pVar4.second;
      local_b8.first._M_node = local_158;
      local_b8.second = (bool)local_150;
      std::
      tie<std::_Rb_tree_iterator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>,bool>
                (local_168,(bool *)&local_20);
      std::
      tuple<std::_Rb_tree_iterator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>&,bool&>
      ::operator=((tuple<std::_Rb_tree_iterator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>&,bool&>
                   *)local_168,&local_b8);
      std::filesystem::__cxx11::path::~path(&local_e8);
    }
    else if (MVar1 == read_write) {
      local_1b0 = this_local;
      path_hta_abi_cxx11_(&local_1a8,this,(Duration)this_local);
      local_1f0.__r = (rep)this_local;
      (**(this->super_Metric)._vptr_Metric)(&local_208);
      meta_00.interval_max.__r = uStack_200;
      meta_00.interval_min.__r = local_208;
      meta_00.interval_factor = local_1f8;
      Header::Header(&local_1e8,local_1f0,meta_00);
      pVar4 = std::
              map<std::chrono::duration<long,std::ratio<1l,1000000000l>>,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>,std::less<std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>>
              ::
              try_emplace<hta::storage::file::FileOpenTag::ReadWrite,std::filesystem::__cxx11::path,hta::storage::file::Metric::Header>
                        ((map<std::chrono::duration<long,std::ratio<1l,1000000000l>>,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>,std::less<std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>>
                          *)&this->files_hta_,(key_type *)&this_local,&local_179,&local_1a8,
                         &local_1e8);
      local_218 = (_Base_ptr)pVar4.first._M_node;
      local_210 = pVar4.second;
      local_178.first._M_node = local_218;
      local_178.second = (bool)local_210;
      std::
      tie<std::_Rb_tree_iterator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>,bool>
                (local_228,(bool *)&local_20);
      std::
      tuple<std::_Rb_tree_iterator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>&,bool&>
      ::operator=((tuple<std::_Rb_tree_iterator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000000l>>const,hta::storage::file::File<hta::storage::file::Metric::Header,hta::TimeAggregate>>>&,bool&>
                   *)local_228,&local_178);
      std::filesystem::__cxx11::path::~path(&local_1a8);
    }
    if ((local_29 & 1) == 0) {
      __assert_fail("added",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/storage/file/metric.cpp"
                    ,0x226,"Metric::HtaFile &hta::storage::file::Metric::file_hta(Duration)");
    }
  }
  ppVar3 = std::
           _Rb_tree_iterator<std::pair<const_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>_>_>
           ::operator->(&local_20);
  return &ppVar3->second;
}

Assistant:

Metric::HtaFile& Metric::file_hta(Duration interval)
{
    auto it = files_hta_.find(interval);
    if (it == files_hta_.end())
    {
        bool added;
        switch (open_mode_)
        {
        case Mode::read:
            std::tie(it, added) =
                files_hta_.try_emplace(interval, FileOpenTag::Read(), path_hta(interval));
            break;
        case Mode::write:
            std::tie(it, added) = files_hta_.try_emplace(
                interval, FileOpenTag::Write(), path_hta(interval), Header(interval, meta()));
            break;
        case Mode::read_write:
            std::tie(it, added) = files_hta_.try_emplace(
                interval, FileOpenTag::ReadWrite(), path_hta(interval), Header(interval, meta()));
            break;
        }
        assert(added);
    }
    return it->second;
}